

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O1

void __thiscall amrex::TagBox::coarsen(TagBox *this,IntVect *ratio,Box *cbox)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  undefined8 uVar19;
  DataAllocator arena;
  long lVar20;
  long lVar21;
  long lVar22;
  char *pcVar23;
  char *pcVar24;
  long lVar25;
  long lVar26;
  char *pcVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  bool bVar35;
  bool bVar36;
  TagBox cfab;
  Elixir eli;
  long local_198;
  char *local_188;
  long local_180;
  char *local_178;
  BaseFab<char> local_90;
  Elixir local_48;
  
  local_188 = (this->super_BaseFab<char>).dptr;
  iVar5 = (this->super_BaseFab<char>).domain.smallend.vect[0];
  iVar6 = (this->super_BaseFab<char>).domain.smallend.vect[1];
  iVar7 = (this->super_BaseFab<char>).domain.smallend.vect[2];
  iVar8 = (this->super_BaseFab<char>).domain.bigend.vect[0];
  iVar9 = (this->super_BaseFab<char>).domain.bigend.vect[1];
  local_90.super_DataAllocator.m_arena = The_Arena();
  local_90._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00750948;
  local_90.dptr = (char *)0x0;
  local_90.domain.smallend.vect._0_8_ = *(undefined8 *)(cbox->smallend).vect;
  uVar3 = *(undefined8 *)(cbox->bigend).vect;
  local_90.domain._20_8_ = *(undefined8 *)((cbox->bigend).vect + 2);
  local_90.domain.smallend.vect[2] = (int)*(undefined8 *)((cbox->smallend).vect + 2);
  local_90.domain.bigend.vect[0] = (int)uVar3;
  local_90.domain.bigend.vect[1] = (int)((ulong)uVar3 >> 0x20);
  local_90.nvar = 1;
  local_90.truesize = 0;
  local_90.ptr_owner = false;
  local_90.shared_memory = false;
  BaseFab<char>::define(&local_90);
  local_90._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00750888;
  arena.m_arena = local_90.super_DataAllocator.m_arena;
  if (local_90.super_DataAllocator.m_arena == (Arena *)0x0) {
    arena.m_arena = The_Arena();
  }
  Gpu::Elixir::Elixir(&local_48,(void *)0x0,arena.m_arena);
  iVar10 = (cbox->smallend).vect[2];
  local_198 = (long)iVar10;
  iVar11 = (cbox->bigend).vect[2];
  if (iVar10 <= iVar11) {
    lVar26 = (long)((iVar8 - iVar5) + 1);
    lVar28 = (long)((iVar9 - iVar6) + 1);
    lVar20 = (long)((local_90.domain.bigend.vect[0] - local_90.domain.smallend.vect[0]) + 1);
    uVar12 = ratio->vect[0];
    lVar29 = (long)(int)uVar12;
    iVar8 = ratio->vect[1];
    lVar32 = (long)iVar8;
    iVar9 = ratio->vect[2];
    lVar33 = (long)iVar9;
    iVar10 = (cbox->smallend).vect[1];
    iVar13 = (cbox->smallend).vect[0];
    lVar34 = iVar13 * lVar29;
    local_188 = local_188 +
                (((((local_198 * lVar33 - (long)iVar7) * lVar28 + iVar10 * lVar32) - (long)iVar6) *
                  lVar26 + lVar34) - (long)iVar5);
    lVar28 = lVar28 * lVar26;
    iVar5 = (cbox->bigend).vect[0];
    iVar6 = (cbox->bigend).vect[1];
    iVar7 = (this->super_BaseFab<char>).domain.bigend.vect[2];
    iVar14 = (this->super_BaseFab<char>).domain.bigend.vect[1];
    iVar15 = (this->super_BaseFab<char>).domain.bigend.vect[0];
    iVar16 = (this->super_BaseFab<char>).domain.smallend.vect[2];
    iVar17 = (this->super_BaseFab<char>).domain.smallend.vect[1];
    iVar18 = (this->super_BaseFab<char>).domain.smallend.vect[0];
    do {
      if (iVar10 <= iVar6) {
        local_178 = local_188;
        local_180 = (long)iVar10;
        do {
          if (iVar13 <= iVar5) {
            lVar21 = lVar34;
            lVar25 = (long)iVar13;
            pcVar27 = local_178;
            do {
              if (iVar9 < 1) {
                bVar36 = false;
              }
              else {
                lVar31 = 0;
                bVar36 = false;
                pcVar24 = pcVar27;
                do {
                  if (0 < iVar8) {
                    lVar1 = lVar31 + local_198 * lVar33;
                    lVar22 = 0;
                    pcVar23 = pcVar24;
                    do {
                      if (0 < (int)uVar12) {
                        lVar2 = lVar22 + local_180 * lVar32;
                        uVar30 = 0;
                        do {
                          if (((((long)iVar18 <= (long)(lVar21 + uVar30)) && (iVar17 <= lVar2)) &&
                              (iVar16 <= lVar1)) &&
                             ((((long)(lVar21 + uVar30) <= (long)iVar15 && (lVar2 <= iVar14)) &&
                              ((lVar1 <= iVar7 && (bVar35 = bVar36 == false, bVar36 = true, bVar35))
                              )))) {
                            bVar36 = pcVar23[uVar30] != '\0';
                          }
                          uVar30 = uVar30 + 1;
                        } while (uVar12 != uVar30);
                      }
                      lVar22 = lVar22 + 1;
                      pcVar23 = pcVar23 + lVar26;
                    } while (lVar22 != lVar32);
                  }
                  lVar31 = lVar31 + 1;
                  pcVar24 = pcVar24 + lVar28;
                } while (lVar31 != lVar33);
              }
              local_90.dptr
              [(lVar25 - local_90.domain.smallend.vect[0]) +
               (local_180 - local_90.domain.smallend.vect[1]) * lVar20 +
               (local_198 - local_90.domain.smallend.vect[2]) *
               ((local_90.domain.bigend.vect[1] - local_90.domain.smallend.vect[1]) + 1) * lVar20] =
                   bVar36;
              lVar25 = lVar25 + 1;
              lVar21 = lVar21 + lVar29;
              pcVar27 = pcVar27 + lVar29;
            } while (iVar5 + 1 != (int)lVar25);
          }
          local_180 = local_180 + 1;
          local_178 = local_178 + lVar32 * lVar26;
        } while (iVar6 + 1 != (int)local_180);
      }
      local_198 = local_198 + 1;
      local_188 = local_188 + lVar28 * lVar33;
    } while (iVar11 + 1 != (int)local_198);
  }
  pcVar27 = BaseFab<char>::dataPtr(&this->super_BaseFab<char>,0);
  uVar3 = *(undefined8 *)(cbox->bigend).vect;
  uVar4 = *(undefined8 *)(cbox->smallend).vect;
  memcpy(pcVar27,local_90.dptr,
         (long)(((cbox->bigend).vect[2] - (cbox->smallend).vect[2]) + 1) *
         (long)(((int)uVar3 - (int)uVar4) + 1) *
         (long)(((int)((ulong)uVar3 >> 0x20) - (int)((ulong)uVar4 >> 0x20)) + 1));
  uVar3 = *(undefined8 *)((cbox->smallend).vect + 2);
  uVar4 = *(undefined8 *)(cbox->bigend).vect;
  uVar19 = *(undefined8 *)((cbox->bigend).vect + 2);
  *(undefined8 *)(this->super_BaseFab<char>).domain.smallend.vect =
       *(undefined8 *)(cbox->smallend).vect;
  *(undefined8 *)((this->super_BaseFab<char>).domain.smallend.vect + 2) = uVar3;
  *(undefined8 *)(this->super_BaseFab<char>).domain.bigend.vect = uVar4;
  *(undefined8 *)((this->super_BaseFab<char>).domain.bigend.vect + 2) = uVar19;
  Gpu::Elixir::~Elixir(&local_48);
  local_90._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00750948;
  BaseFab<char>::clear(&local_90);
  return;
}

Assistant:

void
TagBox::coarsen (const IntVect& ratio, const Box& cbox) noexcept
{
    BL_ASSERT(nComp() == 1);
    Array4<char const> const& farr = this->const_array();

    TagBox cfab(cbox, 1, The_Arena());
    Elixir eli = cfab.elixir();
    Array4<char> const& carr = cfab.array();

    Box fdomain = domain;
    Dim3 r{1,1,1};
    AMREX_D_TERM(r.x = ratio[0];, r.y = ratio[1];, r.z = ratio[2]);

    AMREX_HOST_DEVICE_FOR_3D(cbox, i, j, k,
    {
        TagType t = TagBox::CLEAR;
        for (int koff = 0; koff < r.z; ++koff) {
            int kk = k*r.z + koff;
            for (int joff = 0; joff < r.y; ++joff) {
                int jj = j*r.y + joff;
                for (int ioff = 0; ioff < r.x; ++ioff) {
                    int ii = i*r.x + ioff;
                    if (fdomain.contains(IntVect(AMREX_D_DECL(ii,jj,kk)))) {
                        t = t || farr(ii,jj,kk);
                    }
                }
            }
        }
        carr(i,j,k) = t;
    });

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        Gpu::dtod_memcpy_async(this->dataPtr(), cfab.dataPtr(), sizeof(TagType)*cbox.numPts());
    } else
#endif
    {
        std::memcpy(this->dataPtr(), cfab.dataPtr(), sizeof(TagType)*cbox.numPts());
    }
    this->domain = cbox;
}